

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_string_tests.cpp
# Opt level: O2

void WcsicmpNegativeTest(void)

{
  int iVar1;
  unsigned_long *in_R9;
  AssertionResult iutest_ar;
  iuCodeMessage local_1e8;
  wchar_t negative_sample [5];
  Fixed local_198;
  
  negative_sample[0] = L'a';
  negative_sample[1] = L'a';
  negative_sample[2] = L'a';
  negative_sample[3] = L'\xffffffff';
  negative_sample[4] = L'\0';
  local_198.super_Message.m_stream.super_iu_stringstream._0_8_ = 4;
  local_1e8.m_message._M_dataplus._M_p = (pointer)0x4;
  iutest::internal::CmpHelperGE<unsigned_long,unsigned_long>
            (&iutest_ar,(internal *)"sizeof(::std::wint_t)","sizeof(int)",(char *)&local_198,
             (unsigned_long *)&local_1e8,in_R9);
  if (iutest_ar.m_result == false) {
    memset(&local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1e8,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_string_tests.cpp"
               ,0x30,iutest_ar.m_message._M_dataplus._M_p);
    local_1e8._44_4_ = 0xfffffffd;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_1e8,&local_198);
  }
  else {
    std::__cxx11::string::~string((string *)&iutest_ar);
    local_198.super_Message.m_stream.super_iu_stringstream._0_8_ =
         local_198.super_Message.m_stream.super_iu_stringstream._0_8_ & 0xffffffff00000000;
    iVar1 = wcscasecmp(L"AAA",negative_sample);
    local_1e8.m_message._M_dataplus._M_p._0_4_ = iVar1;
    iutest::internal::CmpHelperLT<int,int>
              (&iutest_ar,(internal *)0x169a26,
               "::iutest::detail::iu_wcsicmp(L\"AAA\", negative_sample)",(char *)&local_198,
               (int *)&local_1e8,(int *)in_R9);
    if (iutest_ar.m_result != false) goto LAB_001552e9;
    memset(&local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1e8,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_string_tests.cpp"
               ,0x31,iutest_ar.m_message._M_dataplus._M_p);
    local_1e8._44_4_ = 1;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_1e8,&local_198);
  }
  std::__cxx11::string::~string((string *)&local_1e8);
  iutest::iu_global_format_stringstream::~iu_global_format_stringstream
            ((iu_global_format_stringstream *)&local_198);
LAB_001552e9:
  std::__cxx11::string::~string((string *)&iutest_ar);
  return;
}

Assistant:

void WcsicmpNegativeTest()
{
    const wchar_t negative = static_cast<wchar_t>(-1);
    const wchar_t negative_sample[] = { L'a', L'a', L'a', negative, L'\0' };
    IUTEST_ASSUME_GE(sizeof(::std::wint_t), sizeof(int));
    IUTEST_EXPECT_LT(0, ::iutest::detail::iu_wcsicmp(L"AAA", negative_sample));
}